

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GPUShader5ImagesArrayIndexing::iterate(GPUShader5ImagesArrayIndexing *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  ostringstream *this_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  GLuint *pGVar8;
  MessageBuilder *this_01;
  ulong uVar9;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  GLuint index;
  ulong uVar16;
  uint uVar17;
  undefined1 local_1b0 [384];
  long lVar7;
  
  initTest(this);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar7 + 0x1680))(this->m_program_id);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xae);
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    (**(code **)(lVar7 + 0x80))(uVar16 & 0xffffffff,this->m_to_ids[uVar16],0,0,0,0x88ba,0x8236);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"Could not bind a texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xb5);
  }
  (**(code **)(lVar7 + 0x528))(1,1,1);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to dispatch compute operation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xbb);
  (**(code **)(lVar7 + 0x6d0))(1,&this->m_fbo_id);
  (**(code **)(lVar7 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Could not create framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc1);
  (**(code **)(lVar7 + 0x1a00))(0,0,this->m_texture_width,this->m_texture_height);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glViewport() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc5);
  pGVar8 = (GLuint *)
           operator_new__((ulong)(uint)(this->m_texture_width * this->m_texture_height * 4) << 2);
  this->m_data_buffer = pGVar8;
  (**(code **)(lVar7 + 0xdb8))(0x80);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Could not set memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xcc);
  uVar16 = 0;
  do {
    if (uVar16 == 4) {
      if (this->m_data_buffer != (GLuint *)0x0) {
        operator_delete__(this->m_data_buffer);
      }
      this->m_data_buffer = (GLuint *)0x0;
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00cfbd8f:
      tcu::TestContext::setTestResult(this_02,testResult,description);
      return STOP;
    }
    (**(code **)(lVar7 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_to_ids[uVar16],0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"Error configuring color attachment for framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd2);
    (**(code **)(lVar7 + 0x1220))
              (0,0,this->m_texture_width,this->m_texture_height,0x8d99,0x1405,this->m_data_buffer);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glReadPixels() call failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd7);
    uVar3 = this->m_texture_width;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = 0;
    }
    pGVar8 = this->m_data_buffer;
    uVar4 = this->m_texture_height;
    if (this->m_texture_height < 1) {
      uVar4 = 0;
    }
    uVar2 = uVar16 + 1;
    uVar11 = uVar16 & 0xffffffff;
    for (uVar15 = 0; uVar16 = uVar2, uVar15 != uVar4; uVar15 = uVar15 + 1) {
      iVar12 = uVar3 * 4 * (int)uVar15;
      iVar10 = (int)uVar11;
      iVar5 = 1;
      lVar14 = 0;
      while (uVar9 * 4 != lVar14) {
        iVar13 = (int)lVar14;
        lVar14 = lVar14 + 4;
        iVar5 = iVar5 + -1;
        uVar17 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar17;
        if (uVar17 != pGVar8[(long)iVar12 + (long)iVar13]) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Invalid image data acquired for image at index ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,", position: (");
          std::ostream::operator<<(this_00,-iVar5);
          std::operator<<((ostream *)this_00,",");
          std::ostream::operator<<(this_00,(int)uVar15);
          std::operator<<((ostream *)this_00,")");
          std::operator<<((ostream *)this_00,". Rendered data [");
          this_01 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,pGVar8 + (long)iVar12 + (long)iVar13);
          poVar1 = &this_01->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " Expected data [");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          if (this->m_data_buffer != (GLuint *)0x0) {
            operator_delete__(this->m_data_buffer);
          }
          this->m_data_buffer = (GLuint *)0x0;
          this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
          description = "Fail";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_00cfbd8f;
        }
      }
      uVar11 = (ulong)(iVar10 + 1);
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5ImagesArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	for (glw::GLuint index = 0; index < m_array_size; index++)
	{
		gl.bindImageTexture(index /* unit */, m_to_ids[index], 0 /* level */, GL_FALSE, /* layered */
							0,															/* layer */
							GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to image unit!");
	}

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch compute operation");

	/* Create and configure a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object");

	/* Set viewport */
	gl.viewport(0, 0, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed");

	/* Allocate space for result data */
	const glw::GLuint dataSize = m_texture_width * m_texture_height * m_texture_n_components * 4;
	m_data_buffer			   = new glw::GLuint[dataSize];

	gl.memoryBarrier(GL_PIXEL_BUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	for (unsigned int i = 0; i < m_array_size; ++i)
	{
		/* Attach texture to framebuffer's color attachment 0 */
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_ids[i], 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring color attachment for framebuffer object!");

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					  m_data_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed!");

		glw::GLuint resultExpected[m_texture_n_components];

		/* Loop over all pixels and compare the rendered data with reference value */
		for (glw::GLint y = 0; y < m_texture_height; ++y)
		{
			glw::GLuint* data_row = m_data_buffer + y * m_texture_width * m_texture_n_components * 4;

			for (glw::GLint x = 0; x < m_texture_width; ++x)
			{
				glw::GLuint* data = data_row + x * m_texture_n_components * 4;

				resultExpected[0] = x + y + 1 + i;

				if (resultExpected[0] != data[0])
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid image data acquired for image at index "
									   << i << ", position: (" << x << "," << y << ")"
									   << ". Rendered data [" << data[0] << "]"
									   << " Expected data [" << resultExpected[0] << "]" << tcu::TestLog::EndMessage;

					delete[] m_data_buffer;
					m_data_buffer = DE_NULL;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				} /* if (data mismatch) */

			} /* for (all columns) */
		}	 /* for (all rows) */
	}		  /*for (m_sizeOfArray)*/

	delete[] m_data_buffer;
	m_data_buffer = DE_NULL;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}